

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

void __thiscall
license::EventRegistry::addEvent(EventRegistry *this,EVENT_TYPE event,SEVERITY severity)

{
  AuditEvent audit;
  value_type local_208;
  
  local_208.param1[0] = '\0';
  local_208.param2[0] = '\0';
  local_208.severity = severity;
  local_208.event_type = event;
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back(&this->logs,&local_208);
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	audit.param1[0] = '\0';
	audit.param2[0] = '\0';
	logs.push_back(audit);
}